

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *
kj::consumeHttpMethod
          (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *__return_storage_ptr__,
          char **ptr)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  
  pbVar3 = (byte *)*ptr;
  if (*pbVar3 - 0x41 < 0x15) {
    pbVar1 = pbVar3 + 1;
    switch((uint)*pbVar3) {
    case 0x41:
      if ((*pbVar1 == 0x43) && (pbVar3[2] == 0x4c)) {
        *ptr = (char *)(pbVar3 + 3);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x11;
        return __return_storage_ptr__;
      }
      break;
    case 0x43:
      if (pbVar3[1] == 0x4f) {
        if (pbVar3[2] == 0x4e) {
          iVar5 = strncmp((char *)(pbVar3 + 3),"NECT",4);
          if (iVar5 == 0) {
            *ptr = (char *)(pbVar3 + 7);
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.tag = 2;
            return __return_storage_ptr__;
          }
        }
        else if ((pbVar3[2] == 0x50) && (pbVar3[3] == 0x59)) {
          *ptr = (char *)(pbVar3 + 4);
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.tag = 1;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 9;
          return __return_storage_ptr__;
        }
      }
      else if ((pbVar3[1] == 0x48) && (iVar5 = strncmp((char *)(pbVar3 + 2),"ECKOUT",6), iVar5 == 0)
              ) {
        *ptr = (char *)(pbVar3 + 8);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x14;
        return __return_storage_ptr__;
      }
      break;
    case 0x44:
      iVar5 = strncmp((char *)pbVar1,"ELETE",5);
      if (iVar5 == 0) {
        *ptr = (char *)(pbVar3 + 6);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 4;
        return __return_storage_ptr__;
      }
      break;
    case 0x47:
      if ((*pbVar1 == 0x45) && (pbVar3[2] == 0x54)) {
        *ptr = (char *)(pbVar3 + 3);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0;
        return __return_storage_ptr__;
      }
      break;
    case 0x48:
      if (((*pbVar1 == 0x45) && (pbVar3[2] == 0x41)) && (pbVar3[3] == 0x44)) {
        *ptr = (char *)(pbVar3 + 4);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 1;
        return __return_storage_ptr__;
      }
      break;
    case 0x4c:
      if (((*pbVar1 == 0x4f) && (pbVar3[2] == 0x43)) && (pbVar3[3] == 0x4b)) {
        *ptr = (char *)(pbVar3 + 4);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 10;
        return __return_storage_ptr__;
      }
      break;
    case 0x4d:
      uVar4 = (int)(char)pbVar3[1] - 0x45U >> 1 |
              (uint)(((int)(char)pbVar3[1] - 0x45U & 1) != 0) << 0x1f;
      if (uVar4 < 8) {
        pbVar1 = pbVar3 + 2;
        switch(uVar4) {
        case 0:
          if (((*pbVar1 == 0x52) && (pbVar3[3] == 0x47)) && (pbVar3[4] == 0x45)) {
            *ptr = (char *)(pbVar3 + 5);
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.tag = 1;
            *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x15;
            return __return_storage_ptr__;
          }
          break;
        case 3:
          if (pbVar3[2] == 0x43) {
            if ((pbVar3[3] == 0x4f) && (pbVar3[4] == 0x4c)) {
              *ptr = (char *)(pbVar3 + 5);
              (__return_storage_ptr__->ptr).isSet = true;
              (__return_storage_ptr__->ptr).field_1.value.tag = 1;
              *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0xb;
              return __return_storage_ptr__;
            }
          }
          else if ((pbVar3[2] == 0x41) &&
                  (iVar5 = strncmp((char *)(pbVar3 + 3),"CTIVITY",7), iVar5 == 0)) {
            *ptr = (char *)(pbVar3 + 10);
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.tag = 1;
            *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x13;
            return __return_storage_ptr__;
          }
          break;
        case 5:
          if ((*pbVar1 == 0x56) && (pbVar3[3] == 0x45)) {
            *ptr = (char *)(pbVar3 + 4);
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.tag = 1;
            *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0xc;
            return __return_storage_ptr__;
          }
          break;
        case 7:
          iVar5 = strncmp((char *)pbVar1,"EARCH",5);
          if (iVar5 == 0) {
            *ptr = (char *)(pbVar3 + 7);
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.tag = 1;
            *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x16;
            return __return_storage_ptr__;
          }
        }
      }
      break;
    case 0x4e:
      iVar5 = strncmp((char *)pbVar1,"OTIFY",5);
      if (iVar5 == 0) {
        *ptr = (char *)(pbVar3 + 6);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x17;
        return __return_storage_ptr__;
      }
      break;
    case 0x4f:
      iVar5 = strncmp((char *)pbVar1,"PTIONS",6);
      if (iVar5 == 0) {
        *ptr = (char *)(pbVar3 + 7);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 7;
        return __return_storage_ptr__;
      }
      break;
    case 0x50:
      bVar2 = pbVar3[1];
      if (bVar2 == 0x55) {
        if (pbVar3[2] == 0x54) {
          *ptr = (char *)(pbVar3 + 3);
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.tag = 1;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 3;
          return __return_storage_ptr__;
        }
        if (((pbVar3[2] == 0x52) && (pbVar3[3] == 0x47)) && (pbVar3[4] == 0x45)) {
          *ptr = (char *)(pbVar3 + 5);
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.tag = 1;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 6;
          return __return_storage_ptr__;
        }
      }
      else if (bVar2 == 0x4f) {
        if ((pbVar3[2] == 0x53) && (pbVar3[3] == 0x54)) {
          *ptr = (char *)(pbVar3 + 4);
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.tag = 1;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 2;
          return __return_storage_ptr__;
        }
      }
      else if (bVar2 == 0x52) {
        if ((pbVar3[2] == 0x4f) && (pbVar3[3] == 0x50)) {
          if (pbVar3[4] == 0x50) {
            iVar5 = strncmp((char *)(pbVar3 + 5),"ATCH",4);
            if (iVar5 == 0) {
              *ptr = (char *)(pbVar3 + 9);
              (__return_storage_ptr__->ptr).isSet = true;
              (__return_storage_ptr__->ptr).field_1.value.tag = 1;
              *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0xe;
              return __return_storage_ptr__;
            }
          }
          else if ((((pbVar3[4] == 0x46) && (pbVar3[5] == 0x49)) && (pbVar3[6] == 0x4e)) &&
                  (pbVar3[7] == 0x44)) {
            *ptr = (char *)(pbVar3 + 8);
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.tag = 1;
            *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0xd;
            return __return_storage_ptr__;
          }
        }
      }
      else if (((bVar2 == 0x41) && (pbVar3[2] == 0x54)) &&
              ((pbVar3[3] == 0x43 && (pbVar3[4] == 0x48)))) {
        *ptr = (char *)(pbVar3 + 5);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 5;
        return __return_storage_ptr__;
      }
      break;
    case 0x52:
      iVar5 = strncmp((char *)pbVar1,"EPORT",5);
      if (iVar5 == 0) {
        *ptr = (char *)(pbVar3 + 6);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x12;
        return __return_storage_ptr__;
      }
      break;
    case 0x53:
      if (pbVar3[1] == 0x55) {
        iVar5 = strncmp((char *)(pbVar3 + 2),"BSCRIBE",7);
        if (iVar5 == 0) {
          *ptr = (char *)(pbVar3 + 9);
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.tag = 1;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x18;
          return __return_storage_ptr__;
        }
      }
      else if ((pbVar3[1] == 0x45) && (iVar5 = strncmp((char *)(pbVar3 + 2),"ARCH",4), iVar5 == 0))
      {
        *ptr = (char *)(pbVar3 + 6);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0xf;
        return __return_storage_ptr__;
      }
      break;
    case 0x54:
      iVar5 = strncmp((char *)pbVar1,"RACE",4);
      if (iVar5 == 0) {
        *ptr = (char *)(pbVar3 + 5);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 8;
        return __return_storage_ptr__;
      }
      break;
    case 0x55:
      if (*pbVar1 == 0x4e) {
        if (pbVar3[2] == 0x53) {
          iVar5 = strncmp((char *)(pbVar3 + 3),"UBSCRIBE",8);
          if (iVar5 == 0) {
            *ptr = (char *)(pbVar3 + 0xb);
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.tag = 1;
            *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x19;
            return __return_storage_ptr__;
          }
        }
        else if ((((pbVar3[2] == 0x4c) && (pbVar3[3] == 0x4f)) && (pbVar3[4] == 0x43)) &&
                (pbVar3[5] == 0x4b)) {
          *ptr = (char *)(pbVar3 + 6);
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.tag = 1;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0x10;
          return __return_storage_ptr__;
        }
      }
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

static kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>> consumeHttpMethod(char*& ptr) {
  char* p = ptr;

#define EXPECT_REST(prefix, suffix) \
  if (strncmp(p, #suffix, sizeof(#suffix)-1) == 0) { \
    ptr = p + (sizeof(#suffix)-1); \
    return kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>>(HttpMethod::prefix##suffix); \
  } else { \
    return kj::none; \
  }

  switch (*p++) {
    case 'A': EXPECT_REST(A,CL)
    case 'C':
      switch (*p++) {
        case 'H': EXPECT_REST(CH,ECKOUT)
        case 'O':
          switch (*p++) {
            case 'P': EXPECT_REST(COP,Y)
            case 'N':
              if (strncmp(p, "NECT", 4) == 0) {
                ptr = p + 4;
                return kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>>(HttpConnectMethod());
              } else {
                return kj::none;
              }
            default: return kj::none;
          }
        default: return kj::none;
      }
    case 'D': EXPECT_REST(D,ELETE)
    case 'G': EXPECT_REST(G,ET)
    case 'H': EXPECT_REST(H,EAD)
    case 'L': EXPECT_REST(L,OCK)
    case 'M':
      switch (*p++) {
        case 'E': EXPECT_REST(ME,RGE)
        case 'K':
          switch (*p++) {
            case 'A': EXPECT_REST(MKA,CTIVITY)
            case 'C': EXPECT_REST(MKC,OL)
            default: return kj::none;
          }
        case 'O': EXPECT_REST(MO,VE)
        case 'S': EXPECT_REST(MS,EARCH)
        default: return kj::none;
      }
    case 'N': EXPECT_REST(N,OTIFY)
    case 'O': EXPECT_REST(O,PTIONS)
    case 'P':
      switch (*p++) {
        case 'A': EXPECT_REST(PA,TCH)
        case 'O': EXPECT_REST(PO,ST)
        case 'R':
          if (*p++ != 'O' || *p++ != 'P') return kj::none;
          switch (*p++) {
            case 'F': EXPECT_REST(PROPF,IND)
            case 'P': EXPECT_REST(PROPP,ATCH)
            default: return kj::none;
          }
        case 'U':
          switch (*p++) {
            case 'R': EXPECT_REST(PUR,GE)
            case 'T': EXPECT_REST(PUT,)
            default: return kj::none;
          }
        default: return kj::none;
      }
    case 'R': EXPECT_REST(R,EPORT)
    case 'S':
      switch (*p++) {
        case 'E': EXPECT_REST(SE,ARCH)
        case 'U': EXPECT_REST(SU,BSCRIBE)
        default: return kj::none;
      }
    case 'T': EXPECT_REST(T,RACE)
    case 'U':
      if (*p++ != 'N') return kj::none;
      switch (*p++) {
        case 'L': EXPECT_REST(UNL,OCK)
        case 'S': EXPECT_REST(UNS,UBSCRIBE)
        default: return kj::none;
      }
    default: return kj::none;
  }
#undef EXPECT_REST
}